

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_2>_>,_vkt::shaderexecutor::ExprP<int>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
::Tuple4(Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_2>_>,_vkt::shaderexecutor::ExprP<int>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
         *this,ExprP<tcu::Vector<float,_2>_> *e0,ExprP<int> *e1,ExprP<vkt::shaderexecutor::Void> *e2
        ,ExprP<vkt::shaderexecutor::Void> *e3)

{
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>::SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)this,
             (SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)e0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<int>_>::SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Expr<int>_> *)&this->b,
             (SharedPtr<const_vkt::shaderexecutor::Expr<int>_> *)e1);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&this->c,
             (SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)e2);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::SharedPtr
            ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)&this->d,
             (SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)e3);
  return;
}

Assistant:

explicit Tuple4 (const T0& e0 = T0(),
					 const T1& e1 = T1(),
					 const T2& e2 = T2(),
					 const T3& e3 = T3())
		: a	(e0)
		, b	(e1)
		, c	(e2)
		, d	(e3)
	{
	}